

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationY<std::complex<double>_>::CRotationY
          (CRotationY<std::complex<double>_> *this,int control,int target,rotation_type *rot,
          int controlState)

{
  int controlState_local;
  rotation_type *rot_local;
  int target_local;
  int control_local;
  CRotationY<std::complex<double>_> *this_local;
  
  rot_local._0_4_ = target;
  rot_local._4_4_ = control;
  _target_local = this;
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075b0d0;
  std::
  make_unique<qclab::qgates::RotationY<std::complex<double>>,int_const&,qclab::QRotation<double>const&>
            ((int *)&this->gate_,(QRotation<double> *)&rot_local);
  if (rot_local._4_4_ < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationY.hpp"
                  ,0x31,
                  "qclab::qgates::CRotationY<std::complex<double>>::CRotationY(const int, const int, const rotation_type &, const int) [T = std::complex<double>]"
                 );
  }
  if (-1 < (int)rot_local) {
    if (rot_local._4_4_ != (int)rot_local) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationY.hpp"
                  ,0x32,
                  "qclab::qgates::CRotationY<std::complex<double>>::CRotationY(const int, const int, const rotation_type &, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationY.hpp"
                ,0x31,
                "qclab::qgates::CRotationY<std::complex<double>>::CRotationY(const int, const int, const rotation_type &, const int) [T = std::complex<double>]"
               );
}

Assistant:

CRotationY( const int control , const int target ,
                    const rotation_type& rot , const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationY< T > >( target , rot ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }